

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugNames::NameIndex::dumpCUs(NameIndex *this,ScopedPrinter *W)

{
  raw_ostream *this_00;
  uint32_t CU;
  uint CU_00;
  StringRef N;
  format_object_base local_58;
  uint64_t local_48;
  uint local_40;
  DelimitedScope<_[_,__]_> local_38;
  ListScope CUScope;
  
  N.Length = 0x18;
  N.Data = "Compilation Unit offsets";
  DelimitedScope<'[',_']'>::DelimitedScope(&local_38,W,N);
  for (CU_00 = 0; CU_00 < (this->Hdr).super_HeaderPOD.CompUnitCount; CU_00 = CU_00 + 1) {
    this_00 = ScopedPrinter::startLine(W);
    local_48 = getCUOffset(this,CU_00);
    local_58.Fmt = "CU[%u]: 0x%08lx\n";
    local_58._vptr_format_object_base = (_func_int **)&PTR_home_01127d90;
    local_40 = CU_00;
    raw_ostream::operator<<(this_00,&local_58);
  }
  DelimitedScope<'[',_']'>::~DelimitedScope(&local_38);
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpCUs(ScopedPrinter &W) const {
  ListScope CUScope(W, "Compilation Unit offsets");
  for (uint32_t CU = 0; CU < Hdr.CompUnitCount; ++CU)
    W.startLine() << format("CU[%u]: 0x%08" PRIx64 "\n", CU, getCUOffset(CU));
}